

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parcor_coefficients_to_linear_predictive_coefficients.cc
# Opt level: O0

bool __thiscall
sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Run
          (ParcorCoefficientsToLinearPredictiveCoefficients *this,
          vector<double,_std::allocator<double>_> *parcor_coefficients,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,Buffer *buffer)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  int iVar5;
  long in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *in_RDI;
  int m_1;
  int m;
  int i;
  double *a;
  double *prev_a;
  double *k;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  value_type __n;
  int local_7c;
  undefined4 in_stack_ffffffffffffff88;
  int iVar6;
  undefined4 in_stack_ffffffffffffff8c;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff98;
  
  iVar5 = *(int *)&in_RDI[1]._M_current + 1;
  if ((((((ulong)in_RDI[1]._M_current & 0x100000000) == 0) ||
       (sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar1 != (long)iVar5))
      || (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) || (in_RCX == 0)) {
    return false;
  }
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar1 != (long)iVar5) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff90._M_current,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 8));
  if (sVar1 != (long)*(int *)&in_RDI[1]._M_current) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff90._M_current,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  __n = *pvVar2;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
  *pvVar3 = __n;
  if (*(int *)&in_RDI[1]._M_current == 0) {
    return true;
  }
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
  operator-(in_RDI,(difference_type)__n);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
  __result._M_current._4_4_ = in_stack_ffffffffffffff8c;
  __result._M_current._0_4_ = in_stack_ffffffffffffff88;
  std::
  copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,__result);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 8),0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
  for (iVar5 = 2; iVar5 <= *(int *)&in_RDI[1]._M_current; iVar5 = iVar5 + 1) {
    for (iVar6 = 1; iVar6 < iVar5; iVar6 = iVar6 + 1) {
      pvVar4[iVar6] = pvVar2[iVar5] * pvVar3[iVar5 - iVar6] + pvVar3[iVar6];
    }
    for (local_7c = 1; local_7c < iVar5; local_7c = local_7c + 1) {
      pvVar3[local_7c] = pvVar4[local_7c];
    }
  }
  pvVar4[*(int *)&in_RDI[1]._M_current] = pvVar2[*(int *)&in_RDI[1]._M_current];
  return true;
}

Assistant:

bool ParcorCoefficientsToLinearPredictiveCoefficients::Run(
    const std::vector<double>& parcor_coefficients,
    std::vector<double>* linear_predictive_coefficients,
    ParcorCoefficientsToLinearPredictiveCoefficients::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      parcor_coefficients.size() != static_cast<std::size_t>(length) ||
      NULL == linear_predictive_coefficients || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (linear_predictive_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    linear_predictive_coefficients->resize(length);
  }
  if (buffer->a_.size() != static_cast<std::size_t>(num_order_)) {
    buffer->a_.resize(num_order_);
  }

  // Copy gain.
  (*linear_predictive_coefficients)[0] = parcor_coefficients[0];
  if (0 == num_order_) {
    return true;
  }

  // Set initial condition.
  std::copy(parcor_coefficients.begin(), parcor_coefficients.end() - 1,
            buffer->a_.begin());

  // Apply recursive formula.
  const double* k(&(parcor_coefficients[0]));
  double* prev_a(&buffer->a_[0]);
  double* a(&((*linear_predictive_coefficients)[0]));
  for (int i(2); i <= num_order_; ++i) {
    for (int m(1); m < i; ++m) {
      a[m] = prev_a[m] + k[i] * prev_a[i - m];
    }
    for (int m(1); m < i; ++m) {
      prev_a[m] = a[m];
    }
  }
  a[num_order_] = k[num_order_];

  return true;
}